

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplifyMathematicalExpressions.cpp
# Opt level: O0

bool isOperator(string *input)

{
  bool bVar1;
  ulong uVar2;
  bool local_22;
  string *input_local;
  
  uVar2 = std::__cxx11::string::size();
  if (1 < uVar2) {
    return false;
  }
  bVar1 = std::operator<=(input,"a");
  if ((!bVar1) && (bVar1 = std::operator>=(input,"z"), !bVar1)) {
    return false;
  }
  bVar1 = std::operator<=(input,"A");
  if ((!bVar1) && (bVar1 = std::operator>=(input,"Z"), !bVar1)) {
    return false;
  }
  bVar1 = std::operator<=(input,"0");
  local_22 = true;
  if (!bVar1) {
    local_22 = std::operator>=(input,"9");
  }
  return local_22;
}

Assistant:

bool isOperator(std::string input){
    if(input.size() > 1){
        return false;
    }
    return (input <= "a" || input >= "z") && (input <= "A" || input >= "Z") && (input <= "0" || input >= "9");
}